

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssi.cpp
# Opt level: O1

void __thiscall pg::SSISolver::compute_vals_ll(SSISolver *this,int side)

{
  bitset *src;
  ulong *puVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  uint *puVar6;
  byte bVar7;
  uint uVar8;
  size_t pos;
  ulong uVar9;
  size_t __n;
  bool bVar10;
  
  bVar10 = side != 0;
  src = &this->G;
  bitset::operator=(&this->C,src);
  lVar4 = ((this->super_Solver).game)->n_vertices;
  if (lVar4 != 0) {
    memset(this->first_in,0xff,lVar4 << 2);
  }
  for (pos = bitset::find_first(src); pos != 0xffffffffffffffff; pos = bitset::find_next(src,pos)) {
    uVar9 = (ulong)(&this->str0)[bVar10][pos];
    if (((&this->halt0)[bVar10]._bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0) {
      piVar5 = this->first_in;
      this->next_in[pos] = piVar5[uVar9];
      piVar5[uVar9] = (uint)pos;
    }
    else {
      iVar2 = (this->Q).pointer;
      (this->Q).pointer = iVar2 + 1;
      (this->Q).queue[iVar2] = (uint)pos;
    }
  }
  while (iVar2 = (this->Q).pointer, iVar2 != 0) {
    (this->Q).pointer = iVar2 + -1;
    uVar8 = (this->Q).queue[(long)iVar2 + -1];
    uVar9 = (ulong)(int)uVar8;
    bVar7 = (byte)uVar8 & 0x3f;
    puVar1 = (this->C)._bits + (uVar9 >> 6);
    *puVar1 = *puVar1 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
    iVar2 = this->k;
    piVar5 = this->val + (int)(iVar2 * uVar8);
    iVar3 = (&this->str0)[bVar10][uVar9];
    if (((&this->halt0)[bVar10]._bits[(ulong)(long)iVar3 >> 6] >> ((long)iVar3 & 0x3fU) & 1) == 0) {
      __n = (long)((iVar3 + 1) * iVar2) * 4 + (long)(iVar3 * iVar2) * -4;
      if (__n != 0) {
        memmove(piVar5,this->val + iVar3 * iVar2,__n);
      }
    }
    else if (iVar2 != 0) {
      memset(piVar5,0,(long)iVar2 << 2);
    }
    piVar5[((this->super_Solver).game)->_priority[uVar9]] =
         piVar5[((this->super_Solver).game)->_priority[uVar9]] + 1;
    uVar8 = this->first_in[uVar9];
    if (uVar8 != 0xffffffff) {
      puVar6 = (this->Q).queue;
      piVar5 = this->next_in;
      do {
        iVar2 = (this->Q).pointer;
        (this->Q).pointer = iVar2 + 1;
        puVar6[iVar2] = uVar8;
        uVar8 = piVar5[(int)uVar8];
      } while (uVar8 != 0xffffffff);
    }
  }
  return;
}

Assistant:

void
SSISolver::compute_vals_ll(int side)
{
    auto & H = side == 0 ? halt0 : halt1;
    auto & S = side == 0 ? str0 : str1;

    // set all vertices in G to "on cycle"
    C = G;

    // find all halting vertices and set the linked list of in edges
    std::fill(first_in, first_in+nodecount(), '\xff');
    for (auto v = G.find_first(); v != bitset::npos; v = G.find_next(v)) {
        int s = S[v];
        if (H[s]) {
            // successor of v is halted
            Q.push(v);
        } else {
            // successor of v is not halted
            next_in[v] = first_in[s];
            first_in[s] = v;
        }
    }

    // walk the finite paths
    while (Q.nonempty()) {
        int v = Q.pop();

        // mark as not on a cycle
        C[v] = false;

        // set valuation
        int *val_v = val + k*v;
        int s = S[v];
        if (H[s]) {
            std::fill(val_v, val_v+k, '\x00');
        } else {
            std::copy(val+k*s, val+k*(s+1), val_v);
        }
        val_v[priority(v)]++;

        // add predecessors
        int from = first_in[v];
        while (from != -1) {
            Q.push(from);
            from = next_in[from];
        }
    }
}